

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmpcfgs.cpp
# Opt level: O0

StrategyConfig * readoptions(StrategyConfig *__return_storage_ptr__,int argc,char **argv)

{
  char *pcVar1;
  Addr AVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  istream *piVar7;
  ulong uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  string *this;
  long lVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  allocator local_78b;
  undefined1 local_78a;
  allocator local_789;
  string local_788 [38];
  undefined1 local_762;
  allocator local_761;
  string local_760 [32];
  pair<unsigned_long,_unsigned_long> local_740;
  string local_730 [32];
  string local_710 [8];
  string line;
  ifstream local_6f0 [520];
  pair<unsigned_long,_unsigned_long> local_4e8;
  allocator local_4d1;
  string local_4d0 [32];
  pair<unsigned_long,_unsigned_long> local_4b0;
  stringstream local_4a0 [8];
  stringstream ss;
  ostream local_490 [383];
  allocator local_311;
  string local_310 [39];
  allocator local_2e9;
  string local_2e8 [38];
  undefined1 local_2c2;
  allocator local_2c1;
  string local_2c0 [38];
  undefined1 local_29a;
  allocator local_299;
  string local_298 [48];
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  local_268;
  undefined1 local_249;
  istream local_248 [8];
  ifstream input;
  unsigned_long local_40;
  Addr end;
  Addr start;
  char *idx;
  char **ppcStack_20;
  int opt;
  char **argv_local;
  StrategyConfig *pSStack_10;
  int argc_local;
  StrategyConfig *config;
  
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pSStack_10 = __return_storage_ptr__;
  std::ifstream::ifstream(local_248);
  local_249 = 0;
  local_268.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  local_268.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  local_268.
  super__List_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::list(&local_268);
  StrategyConfig::StrategyConfig
            (__return_storage_ptr__,false,false,false,false,&local_268,(char *)0x0,(char *)0x0,
             (char *)0x0,(char *)0x0,(char *)0x0);
  std::__cxx11::
  list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~list(&local_268);
  do {
    idx._4_4_ = getopt(argv_local._4_4_,ppcStack_20,":cps:br:a:A:i:o:d:");
    if (idx._4_4_ == -1) {
      if (argv_local._4_4_ <= _optind + 1) {
        usage(*ppcStack_20);
      }
      lVar10 = (long)_optind;
      _optind = _optind + 1;
      __return_storage_ptr__->input1 = ppcStack_20[lVar10];
      lVar10 = (long)_optind;
      _optind = _optind + 1;
      __return_storage_ptr__->input2 = ppcStack_20[lVar10];
      if (argv_local._4_4_ <= _optind) {
        if (((__return_storage_ptr__->both & 1U) == 0) &&
           ((__return_storage_ptr__->specific & 1U) != 0)) {
          this = (string *)__cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(this,"-b must be used with specific strategy",&local_78b);
          __cxa_throw(this,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        local_249 = 1;
        std::ifstream::~ifstream(local_248);
        return __return_storage_ptr__;
      }
      local_78a = 1;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_788,"Unknown extra option: ",&local_789);
      std::operator+(pbVar9,(char *)local_788);
      local_78a = 0;
      __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
    switch(idx._4_4_) {
    case 0x41:
      std::ifstream::ifstream(local_6f0,_optarg,_S_in);
      std::ifstream::operator=(local_248,local_6f0);
      std::ifstream::~ifstream(local_6f0);
      std::__cxx11::string::string(local_710);
      while( true ) {
        piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_248,local_710)
        ;
        bVar3 = std::ios::operator_cast_to_bool
                          ((ios *)(piVar7 + *(long *)(*(long *)piVar7 + -0x18)));
        if (!bVar3) break;
        trim((string *)local_710);
        uVar8 = std::__cxx11::string::length();
        if (1 < uVar8) {
          iVar4 = std::__cxx11::string::compare((ulong)local_710,0,(char *)0x2);
          if (iVar4 != 0) {
            std::__cxx11::string::substr((ulong)local_730,(ulong)local_710);
            std::__cxx11::string::operator=(local_710,local_730);
            std::__cxx11::string::~string(local_730);
          }
        }
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          end = std::__cxx11::stoul((string *)local_710,(size_t *)0x0,0x10);
          if (end != 0) {
            pVar11 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&end);
            local_740 = pVar11;
            std::__cxx11::
            list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back(&__return_storage_ptr__->ranges,&local_740);
          }
        }
      }
      std::__cxx11::string::~string(local_710);
      std::ifstream::close();
      break;
    default:
      local_762 = 1;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_760,"Invalid option: ",&local_761);
      std::operator+(pbVar9,(char)local_760);
      local_762 = 0;
      __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    case 0x61:
      iVar4 = strncasecmp(_optarg,"0x",2);
      if (iVar4 != 0) {
        _optarg = _optarg + 2;
      }
      pcVar1 = _optarg;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_4d0,pcVar1,&local_4d1);
      end = std::__cxx11::stoul((string *)local_4d0,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_4d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
      if (end != 0) {
        pVar11 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&end);
        local_4e8 = pVar11;
        std::__cxx11::
        list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ::push_back(&__return_storage_ptr__->ranges,&local_4e8);
      }
      break;
    case 0x62:
      __return_storage_ptr__->both = true;
      break;
    case 99:
      __return_storage_ptr__->compress = true;
      break;
    case 100:
      __return_storage_ptr__->dump = _optarg;
      break;
    case 0x69:
      __return_storage_ptr__->instrs = _optarg;
      break;
    case 0x6f:
      __return_storage_ptr__->output = _optarg;
      break;
    case 0x70:
      __return_storage_ptr__->detailed = true;
      break;
    case 0x72:
      start = (Addr)strchr(_optarg,0x3a);
      if ((char *)start == (char *)0x0) {
        local_2c2 = 1;
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 __cxa_allocate_exception(0x20);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2c0,"invalid range: ",&local_2c1);
        std::operator+(pbVar9,(char *)local_2c0);
        local_2c2 = 0;
        __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      *(char *)start = '\0';
      start = start + 1;
      iVar4 = strncasecmp(_optarg,"0x",2);
      if (iVar4 != 0) {
        _optarg = _optarg + 2;
      }
      iVar4 = strncasecmp((char *)start,"0x",2);
      pcVar1 = _optarg;
      if (iVar4 != 0) {
        start = start + 2;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2e8,pcVar1,&local_2e9);
      end = std::__cxx11::stoul((string *)local_2e8,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_2e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
      AVar2 = start;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_310,(char *)AVar2,&local_311);
      local_40 = std::__cxx11::stoul((string *)local_310,(size_t *)0x0,0x10);
      std::__cxx11::string::~string(local_310);
      std::allocator<char>::~allocator((allocator<char> *)&local_311);
      if (local_40 < end) {
        std::__cxx11::stringstream::stringstream(local_4a0);
        std::ostream::operator<<(local_490,std::hex);
        poVar5 = std::operator<<(local_490,"invalid range: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_40);
        poVar5 = std::operator<<(poVar5," < ");
        std::ostream::operator<<(poVar5,end);
        uVar6 = __cxa_allocate_exception(0x20);
        std::__cxx11::stringstream::str();
        __cxa_throw(uVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      pVar11 = std::make_pair<unsigned_long&,unsigned_long&>(&end,&local_40);
      local_4b0 = pVar11;
      std::__cxx11::
      list<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::push_back(&__return_storage_ptr__->ranges,&local_4b0);
      break;
    case 0x73:
      iVar4 = strcasecmp(_optarg,"simple");
      if (iVar4 == 0) {
        __return_storage_ptr__->specific = false;
      }
      else {
        iVar4 = strcasecmp(_optarg,"specific");
        if (iVar4 != 0) {
          local_29a = 1;
          pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   __cxa_allocate_exception(0x20);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_298,"Invalid strategy: ",&local_299);
          std::operator+(pbVar9,(char *)local_298);
          local_29a = 0;
          __cxa_throw(pbVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
        }
        __return_storage_ptr__->specific = true;
      }
    }
  } while( true );
}

Assistant:

StrategyConfig readoptions(int argc, char* argv[]) {
	int opt;
	char* idx;
	Addr start, end;
	std::ifstream input;
	StrategyConfig config;

	while ((opt = getopt(argc, argv, ":cps:br:a:A:i:o:d:")) != -1) {
		switch (opt) {
			case 'c':
				config.compress = true;
				break;
			case 'p':
				config.detailed = true;
				break;
			case 's':
				if (strcasecmp(optarg, "simple") == 0)
					config.specific = false;
				else if (strcasecmp(optarg, "specific") == 0)
					config.specific = true;
				else
					throw std::string("Invalid strategy: ") + optarg;
				break;
			case 'b':
				config.both = true;
				break;
			case 'r':
				idx = strchr(optarg, ':');
				if (!idx)
					throw std::string("invalid range: ") + optarg;

				*idx = 0;
				idx++;

				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;
				if (strncasecmp(idx, "0x", 2))
					idx += 2;

				start = std::stoul(optarg, 0, 16);
				end = std::stoul(idx, 0, 16);

				if (end < start) {
					std::stringstream ss;
					ss << std::hex;
					ss << "invalid range: " << end << " < " << start;

					throw ss.str();
				}

				config.ranges.push_back(std::make_pair(start, end));
				break;
			case 'a':
				if (strncasecmp(optarg, "0x", 2))
					optarg += 2;

				start = std::stoul(optarg, 0, 16);
				if (start != 0)
					config.ranges.push_back(std::make_pair(start, start));
				break;
			case 'A':
				input = std::ifstream(optarg);
				for (std::string line; getline(input, line); ) {
					trim(line);

					if (line.length() >= 2 && line.compare(0, 2, "0x"))
						line = line.substr(2);

					if (line.empty())
						continue;

					start = std::stoul(line, 0, 16);
					if (start != 0)
						config.ranges.push_back(std::make_pair(start, start));
				}
				input.close();

				break;
			case 'i':
				config.instrs = optarg;
				break;
			case 'o':
				config.output = optarg;
				break;
			case 'd':
				config.dump = optarg;
				break;
			default:
				throw std::string("Invalid option: ") + (char) optopt;
		}
	}

	if (optind+1 >= argc)
		usage(argv[0]);

	config.input1 = argv[optind++];
	config.input2 = argv[optind++];

	if (optind < argc)
		throw std::string("Unknown extra option: ") + argv[optind];

	if (!config.both && config.specific)
		throw std::string("-b must be used with specific strategy");

	return config;
}